

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_decompress.cc
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  string input;
  string output;
  string outfilename;
  string local_88;
  string local_68;
  string filename;
  WOFF2StringOut out;
  long local_10;
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&filename,argv[1],(allocator *)&outfilename);
    std::__cxx11::string::find_last_of((char *)&filename,0x103039);
    std::__cxx11::string::substr((ulong)&input,(ulong)&filename);
    std::operator+(&outfilename,&input,".ttf");
    std::__cxx11::string::~string((string *)&input);
    std::__cxx11::string::string((string *)&local_68,(string *)&filename);
    woff2::GetFileContent(&input,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    uVar2 = woff2::ComputeWOFF2FinalSize((uchar *)input._M_dataplus._M_p,input._M_string_length);
    uVar4 = 0;
    if (uVar2 < 0x1e00000) {
      uVar4 = uVar2;
    }
    output._M_dataplus._M_p = (pointer)&output.field_2;
    std::__cxx11::string::_M_construct((ulong)&output,(char)uVar4);
    woff2::WOFF2StringOut::WOFF2StringOut(&out,(string *)&output);
    bVar1 = woff2::ConvertWOFF2ToTTF
                      ((uchar *)input._M_dataplus._M_p,input._M_string_length,(WOFF2Out *)&out);
    if (bVar1 != 0) {
      std::__cxx11::string::string((string *)&local_88,(string *)&outfilename);
      woff2::SetFileContents
                (&local_88,(iterator)output._M_dataplus._M_p,
                 (iterator)(output._M_dataplus._M_p + local_10));
      std::__cxx11::string::~string((string *)&local_88);
    }
    uVar3 = (uint)(bVar1 ^ 1);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&input);
    std::__cxx11::string::~string((string *)&outfilename);
    std::__cxx11::string::~string((string *)&filename);
  }
  else {
    fwrite("One argument, the input filename, must be provided.\n",0x34,1,_stderr);
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

int main(int argc, char **argv) {
  using std::string;

  if (argc != 2) {
    fprintf(stderr, "One argument, the input filename, must be provided.\n");
    return 1;
  }

  string filename(argv[1]);
  string outfilename = filename.substr(0, filename.find_last_of(".")) + ".ttf";

  // Note: update woff2_dec_fuzzer_new_entry.cc if this pattern changes.
  string input = woff2::GetFileContent(filename);
  const uint8_t* raw_input = reinterpret_cast<const uint8_t*>(input.data());
  string output(std::min(woff2::ComputeWOFF2FinalSize(raw_input, input.size()),
                         woff2::kDefaultMaxSize), 0);
  woff2::WOFF2StringOut out(&output);

  const bool ok = woff2::ConvertWOFF2ToTTF(raw_input, input.size(), &out);

  if (ok) {
    woff2::SetFileContents(outfilename, output.begin(),
        output.begin() + out.Size());
  }
  return ok ? 0 : 1;
}